

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

UniValue * SummaryToJSON(UniValue *__return_storage_ptr__,IndexSummary *summary,string *index_name)

{
  __type_conflict _Var1;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdc8;
  UniValue in_stack_fffffffffffffde8;
  UniValue local_1b0;
  string local_158 [32];
  UniValue local_138;
  string local_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  UniValue entry;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string((string *)&local_48);
  if (index_name->_M_string_length != 0) {
    _Var1 = std::operator==(index_name,&summary->name);
    if (!_Var1) goto LAB_002ec866;
  }
  local_c0 = local_b0;
  local_b8 = 0;
  local_b0[0] = 0;
  UniValue::UniValue(&entry,VOBJ,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"synced",(allocator<char> *)&stack0xfffffffffffffdd7);
  UniValue::UniValue<const_bool_&,_bool,_true>(&local_138,&summary->synced);
  UniValue::pushKV(&entry,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue(&local_138);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"best_block_height",(allocator<char> *)&stack0xfffffffffffffdd7);
  UniValue::UniValue<const_int_&,_int,_true>(&local_1b0,&summary->best_block_height);
  UniValue::pushKV(&entry,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue(&local_1b0);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe30,&summary->name);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffdd8,&entry);
  UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffdc8,in_stack_fffffffffffffde8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdd8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  UniValue::~UniValue(&entry);
LAB_002ec866:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue SummaryToJSON(const IndexSummary&& summary, std::string index_name)
{
    UniValue ret_summary(UniValue::VOBJ);
    if (!index_name.empty() && index_name != summary.name) return ret_summary;

    UniValue entry(UniValue::VOBJ);
    entry.pushKV("synced", summary.synced);
    entry.pushKV("best_block_height", summary.best_block_height);
    ret_summary.pushKV(summary.name, std::move(entry));
    return ret_summary;
}